

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

void __thiscall QKmsDevice::createScreens(QKmsDevice *this)

{
  iterator __first;
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  VirtualDesktopLayout VVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  QPlatformScreen *pQVar9;
  OrderedScreen *pOVar10;
  OrderedScreen *pOVar11;
  QDebug *pQVar12;
  QList<QPlatformScreen_*> *pQVar13;
  qsizetype qVar14;
  reference ppQVar15;
  reference pQVar16;
  long *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  int i_1;
  QPlatformScreen *s_2;
  OrderedScreen *orderedScreen_1;
  QList<OrderedScreen> *__range1_1;
  int primarySiblingIdx;
  OrderedScreen *s_1;
  QList<OrderedScreen> *__range3;
  QPlatformScreen *screenThisScreenClones;
  OrderedScreen *s;
  QList<OrderedScreen> *__range2;
  OrderedScreen *orderedScreen;
  QList<OrderedScreen> *__range1;
  QPlatformScreen *screen_1;
  drmModeConnectorPtr connector;
  int i;
  int idx;
  int wantedConnectorIndex;
  drmModeResPtr resources;
  QPlatformScreen *screen;
  QPoint virtualPos;
  iterator __end1_1;
  iterator __begin1_1;
  QList<QPoint> virtualPositions;
  QList<QPlatformScreen_*> siblings;
  QPoint pos;
  iterator __end3;
  iterator __begin3;
  iterator __end2;
  iterator __begin2;
  QList<QPlatformScreen_*> screensCloningThisScreen;
  iterator __end1;
  iterator __begin1;
  ScreenInfo vinfo;
  bool ok;
  QList<OrderedScreen> screens;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_8;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_7;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_6;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_5;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  int in_stack_fffffffffffff928;
  int in_stack_fffffffffffff92c;
  undefined4 in_stack_fffffffffffff930;
  int in_stack_fffffffffffff934;
  QString *in_stack_fffffffffffff938;
  iterator in_stack_fffffffffffff940;
  undefined7 in_stack_fffffffffffff948;
  byte in_stack_fffffffffffff94f;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  QKmsDevice *in_stack_fffffffffffff980;
  int local_664;
  QPlatformScreen *local_650;
  uint local_604;
  uint local_5fc;
  undefined1 local_5e0 [56];
  QDebug local_5a8;
  QDebug local_5a0;
  QDebug local_598;
  undefined1 local_590 [16];
  undefined1 local_580 [32];
  ScreenInfo *in_stack_fffffffffffffaa0;
  drmModeConnectorPtr in_stack_fffffffffffffaa8;
  drmModeResPtr in_stack_fffffffffffffab0;
  QDebug in_stack_fffffffffffffab8;
  QDebug local_540;
  QDebug local_538;
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  QPoint local_510;
  OrderedScreen *local_508;
  iterator local_500;
  iterator local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  QList<QPlatformScreen_*> local_4d8;
  QPoint local_4c0;
  undefined1 local_4b8 [56];
  QDebug local_480;
  QDebug local_478;
  QDebug local_470;
  undefined1 local_468 [56];
  QDebug local_430;
  OrderedScreen *local_428;
  iterator local_420;
  iterator local_418;
  OrderedScreen *local_410;
  iterator local_408;
  iterator local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  OrderedScreen *local_3e0;
  iterator local_3d8;
  iterator local_3d0 [5];
  QDebug local_3a8;
  QDebug local_3a0;
  QDebug local_398 [33];
  undefined1 local_290 [248];
  char local_198 [39];
  bool local_171 [25];
  char local_158 [32];
  char local_138 [32];
  char local_118 [32];
  char local_f8 [32];
  undefined1 local_d8 [24];
  undefined1 local_c0 [8];
  char local_b8 [32];
  undefined8 local_98;
  ulong local_90;
  undefined8 local_88;
  ulong local_80;
  undefined8 local_78;
  ulong local_70;
  undefined8 local_68;
  ulong local_60;
  undefined8 local_58;
  ulong local_50;
  undefined8 local_48;
  ulong local_40;
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QKmsScreenConfig::headless((QKmsScreenConfig *)in_RDI[1]);
  if (bVar2) {
    lVar6 = (**(code **)(*in_RDI + 0x30))();
    if (lVar6 != 0) {
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      qLcKmsDebug();
      anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
      while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
        anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x119008);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffff940.i,(char *)in_stack_fffffffffffff938,
                   in_stack_fffffffffffff934,
                   (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                   (char *)0x119021);
        QMessageLogger::debug(local_b8,"Headless mode enabled");
        local_10 = local_10 & 0xffffffffffffff00;
      }
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     in_stack_fffffffffffff92c,in_stack_fffffffffffff928);
      memset(local_d8,0,0x18);
      QList<QPlatformScreen_*>::QList((QList<QPlatformScreen_*> *)0x119080);
      (**(code **)(*in_RDI + 0x40))(in_RDI,lVar6,1,local_c0,local_d8);
      QList<QPlatformScreen_*>::~QList((QList<QPlatformScreen_*> *)0x1190b2);
      goto LAB_0011a369;
    }
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffff940.i,(char *)in_stack_fffffffffffff938,
               in_stack_fffffffffffff934,
               (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
    QMessageLogger::warning
              (local_f8,
               "QKmsDevice: Requested headless mode without support in the backend. Request is ignored."
              );
  }
  drmSetClientCap((int)in_RDI[5],2,1);
  iVar3 = drmSetClientCap((int)in_RDI[5],3,1);
  *(byte *)((long)in_RDI + 0x2c) = (iVar3 != 0 ^ 0xffU) & 1;
  if ((*(byte *)((long)in_RDI + 0x2c) & 1) != 0) {
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    qLcKmsDebug();
    anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar2) {
      anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x119186);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffff940.i,(char *)in_stack_fffffffffffff938,
                 in_stack_fffffffffffff934,
                 (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                 (char *)0x11919f);
      QMessageLogger::debug(local_118,"Atomic reported as supported");
      local_20 = local_20 & 0xffffffffffffff00;
    }
    iVar3 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_ATOMIC",(bool *)0x0);
    if (iVar3 == 0) {
      local_48 = 0xaaaaaaaaaaaaaaaa;
      local_40 = 0xaaaaaaaaaaaaaaaa;
      qLcKmsDebug();
      anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
      while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_48), bVar2) {
        anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1192bc);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffff940.i,(char *)in_stack_fffffffffffff938,
                   in_stack_fffffffffffff934,
                   (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                   (char *)0x1192d5);
        QMessageLogger::debug(local_158,"Atomic disabled");
        local_40 = local_40 & 0xffffffffffffff00;
      }
      *(undefined1 *)((long)in_RDI + 0x2c) = 0;
    }
    else {
      local_38 = 0xaaaaaaaaaaaaaaaa;
      local_30 = 0xaaaaaaaaaaaaaaaa;
      qLcKmsDebug();
      anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
      while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_38), bVar2) {
        anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11922b);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffff940.i,(char *)in_stack_fffffffffffff938,
                   in_stack_fffffffffffff934,
                   (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                   (char *)0x119244);
        QMessageLogger::debug(local_138,"Atomic enabled");
        local_30 = local_30 & 0xffffffffffffff00;
      }
    }
  }
  lVar6 = drmModeGetResources((int)in_RDI[5]);
  if (lVar6 == 0) {
    piVar7 = __errno_location();
    qErrnoWarning(*piVar7,"drmModeGetResources failed");
  }
  else {
    discoverPlanes(in_stack_fffffffffffff980);
    local_171[1] = true;
    local_171[2] = true;
    local_171[3] = true;
    local_171[4] = true;
    local_171[5] = true;
    local_171[6] = true;
    local_171[7] = true;
    local_171[8] = true;
    local_171[9] = true;
    local_171[10] = true;
    local_171[0xb] = true;
    local_171[0xc] = true;
    local_171[0xd] = true;
    local_171[0xe] = true;
    local_171[0xf] = true;
    local_171[0x10] = true;
    local_171[0x11] = true;
    local_171[0x12] = true;
    local_171[0x13] = true;
    local_171[0x14] = true;
    local_171[0x15] = true;
    local_171[0x16] = true;
    local_171[0x17] = true;
    local_171[0x18] = true;
    QList<OrderedScreen>::QList((QList<OrderedScreen> *)0x11937e);
    local_5fc = 0xffffffff;
    local_171[0] = true;
    uVar4 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_CONNECTOR_INDEX",local_171);
    uVar1 = local_5fc;
    if (((local_171[0] & 1U) != 0) &&
       (((int)uVar4 < 0 || (uVar1 = uVar4, *(int *)(lVar6 + 0x20) <= (int)uVar4)))) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffff940.i,(char *)in_stack_fffffffffffff938,
                 in_stack_fffffffffffff934,
                 (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
      QMessageLogger::warning
                (local_198,"Invalid connector index %d, must be between 0 and %u",(ulong)uVar4,
                 (ulong)(*(int *)(lVar6 + 0x20) - 1));
      uVar1 = local_5fc;
    }
    local_5fc = uVar1;
    for (local_604 = 0; (int)local_604 < *(int *)(lVar6 + 0x20); local_604 = local_604 + 1) {
      if ((((int)local_5fc < 0) || (local_604 == local_5fc)) &&
         (lVar8 = drmModeGetConnector((int)in_RDI[5],
                                      *(undefined4 *)
                                       (*(long *)(lVar6 + 0x28) + (long)(int)local_604 * 4)),
         lVar8 != 0)) {
        memcpy(local_290,&DAT_00137b18,0xf8);
        ScreenInfo::ScreenInfo
                  ((ScreenInfo *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
        pQVar9 = createScreenForConnector
                           ((QKmsDevice *)in_stack_fffffffffffffab8.stream,in_stack_fffffffffffffab0
                            ,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
        if (pQVar9 != (QPlatformScreen *)0x0) {
          OrderedScreen::OrderedScreen
                    ((OrderedScreen *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     (QPlatformScreen *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (ScreenInfo *)0x11951d);
          QList<OrderedScreen>::append
                    ((QList<OrderedScreen> *)
                     CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     (rvalue_ref)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          OrderedScreen::~OrderedScreen((OrderedScreen *)0x11953f);
        }
        drmModeFreeConnector(lVar8);
        ScreenInfo::~ScreenInfo((ScreenInfo *)0x119559);
      }
    }
    drmModeFreeResources(lVar6);
    QList<OrderedScreen>::begin
              ((QList<OrderedScreen> *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930)
              );
    QList<OrderedScreen>::end
              ((QList<OrderedScreen> *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930)
              );
    __first.i._7_1_ = in_stack_fffffffffffff94f;
    __first.i._0_7_ = in_stack_fffffffffffff948;
    std::
    stable_sort<QList<OrderedScreen>::iterator,bool(*)(OrderedScreen_const&,OrderedScreen_const&)>
              (__first,in_stack_fffffffffffff940,
               (_func_bool_OrderedScreen_ptr_OrderedScreen_ptr *)
               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    qLcKmsDebug();
    anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_58), bVar2) {
      anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x119618);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffff940.i,(char *)in_stack_fffffffffffff938,
                 in_stack_fffffffffffff934,
                 (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                 (char *)0x119631);
      QMessageLogger::debug();
      pQVar12 = QDebug::operator<<((QDebug *)
                                   CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                                   (char *)CONCAT44(in_stack_fffffffffffff97c,
                                                    in_stack_fffffffffffff978));
      QDebug::QDebug(&local_3a0,pQVar12);
      ::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                   (QList<OrderedScreen> *)in_stack_fffffffffffff940.i);
      QDebug::~QDebug(local_398);
      QDebug::~QDebug(&local_3a0);
      QDebug::~QDebug(&local_3a8);
      local_50 = local_50 & 0xffffffffffffff00;
    }
    local_3d0[0].i = (OrderedScreen *)0xaaaaaaaaaaaaaaaa;
    local_3d0[0] = QList<OrderedScreen>::begin
                             ((QList<OrderedScreen> *)
                              CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    local_3d8.i = (OrderedScreen *)0xaaaaaaaaaaaaaaaa;
    local_3d8 = QList<OrderedScreen>::end
                          ((QList<OrderedScreen> *)
                           CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    while( true ) {
      local_3e0 = local_3d8.i;
      bVar2 = QList<OrderedScreen>::iterator::operator!=(local_3d0,local_3d8);
      if (!bVar2) break;
      pOVar11 = QList<OrderedScreen>::iterator::operator*(local_3d0);
      local_3f8 = 0xaaaaaaaaaaaaaaaa;
      local_3f0 = 0xaaaaaaaaaaaaaaaa;
      local_3e8 = 0xaaaaaaaaaaaaaaaa;
      QList<QPlatformScreen_*>::QList((QList<QPlatformScreen_*> *)0x1197b4);
      local_400.i = (OrderedScreen *)0xaaaaaaaaaaaaaaaa;
      local_400 = QList<OrderedScreen>::begin
                            ((QList<OrderedScreen> *)
                             CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
      local_408.i = (OrderedScreen *)0xaaaaaaaaaaaaaaaa;
      local_408 = QList<OrderedScreen>::end
                            ((QList<OrderedScreen> *)
                             CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
      while( true ) {
        local_410 = local_408.i;
        bVar2 = QList<OrderedScreen>::iterator::operator!=(&local_400,local_408);
        if (!bVar2) break;
        QList<OrderedScreen>::iterator::operator*(&local_400);
        bVar2 = operator==((QString *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                           (QString *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928))
        ;
        if (bVar2) {
          QList<QPlatformScreen_*>::append
                    ((QList<QPlatformScreen_*> *)0x1198bd,
                     (parameter_type)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        }
        QList<OrderedScreen>::iterator::operator++(&local_400);
      }
      local_650 = (QPlatformScreen *)0x0;
      bVar2 = QString::isEmpty((QString *)0x1198f9);
      if (!bVar2) {
        local_418.i = (OrderedScreen *)0xaaaaaaaaaaaaaaaa;
        local_418 = QList<OrderedScreen>::begin
                              ((QList<OrderedScreen> *)
                               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
        local_420.i = (OrderedScreen *)0xaaaaaaaaaaaaaaaa;
        local_420 = QList<OrderedScreen>::end
                              ((QList<OrderedScreen> *)
                               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
        while( true ) {
          local_428 = local_420.i;
          bVar2 = QList<OrderedScreen>::iterator::operator!=(&local_418,local_420);
          if (!bVar2) break;
          pOVar10 = QList<OrderedScreen>::iterator::operator*(&local_418);
          bVar2 = operator==((QString *)
                             CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          if (bVar2) {
            local_650 = pOVar10->screen;
            break;
          }
          QList<OrderedScreen>::iterator::operator++(&local_418);
        }
      }
      if (local_650 != (QPlatformScreen *)0x0) {
        local_68 = 0xaaaaaaaaaaaaaaaa;
        local_60 = 0xaaaaaaaaaaaaaaaa;
        qLcKmsDebug();
        anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                   CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928)
                  );
        while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_68), bVar2) {
          anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x119a73);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffff940.i,(char *)in_stack_fffffffffffff938
                     ,in_stack_fffffffffffff934,
                     (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (char *)0x119a8c);
          QMessageLogger::debug();
          (**(code **)(*(long *)pOVar11->screen + 0x90))(local_468);
          QDebug::operator<<((QDebug *)in_stack_fffffffffffff940.i,in_stack_fffffffffffff938);
          QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948)
                             ,(char *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978))
          ;
          QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930)
                             ,(void *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928))
          ;
          QString::~QString((QString *)0x119afe);
          QDebug::~QDebug(&local_430);
          local_60 = local_60 & 0xffffffffffffff00;
        }
      }
      bVar2 = QList<QPlatformScreen_*>::isEmpty((QList<QPlatformScreen_*> *)0x119b27);
      if (!bVar2) {
        local_78 = 0xaaaaaaaaaaaaaaaa;
        local_70 = 0xaaaaaaaaaaaaaaaa;
        qLcKmsDebug();
        anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                   CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928)
                  );
        while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_78), bVar2) {
          anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x119b85);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffff940.i,(char *)in_stack_fffffffffffff938
                     ,in_stack_fffffffffffff934,
                     (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (char *)0x119b9e);
          QMessageLogger::debug();
          (**(code **)(*(long *)pOVar11->screen + 0x90))(local_4b8);
          QDebug::operator<<((QDebug *)in_stack_fffffffffffff940.i,in_stack_fffffffffffff938);
          pQVar12 = QDebug::operator<<((QDebug *)
                                       CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948)
                                       ,(char *)CONCAT44(in_stack_fffffffffffff97c,
                                                         in_stack_fffffffffffff978));
          QDebug::QDebug(&local_478,pQVar12);
          ::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                       (QList<QPlatformScreen_*> *)in_stack_fffffffffffff940.i);
          QDebug::~QDebug(&local_470);
          QDebug::~QDebug(&local_478);
          QString::~QString((QString *)0x119c47);
          QDebug::~QDebug(&local_480);
          local_70 = local_70 & 0xffffffffffffff00;
        }
      }
      (**(code **)(*in_RDI + 0x38))(in_RDI,pOVar11->screen,local_650,&local_3f8);
      QList<QPlatformScreen_*>::~QList((QList<QPlatformScreen_*> *)0x119c96);
      QList<OrderedScreen>::iterator::operator++(local_3d0);
    }
    local_4c0.xp.m_i = -0x55555556;
    local_4c0.yp.m_i = -0x55555556;
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                   in_stack_fffffffffffff92c,in_stack_fffffffffffff928);
    local_4d8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_4d8.d.ptr = (QPlatformScreen **)0xaaaaaaaaaaaaaaaa;
    local_4d8.d.size = -0x5555555555555556;
    QList<QPlatformScreen_*>::QList((QList<QPlatformScreen_*> *)0x119d02);
    local_4f0 = 0xaaaaaaaaaaaaaaaa;
    local_4e8 = 0xaaaaaaaaaaaaaaaa;
    local_4e0 = 0xaaaaaaaaaaaaaaaa;
    QList<QPoint>::QList((QList<QPoint> *)0x119d3c);
    local_664 = -1;
    local_4f8.i = (OrderedScreen *)0xaaaaaaaaaaaaaaaa;
    local_4f8 = QList<OrderedScreen>::begin
                          ((QList<OrderedScreen> *)
                           CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    local_500.i = (OrderedScreen *)0xaaaaaaaaaaaaaaaa;
    local_500 = QList<OrderedScreen>::end
                          ((QList<OrderedScreen> *)
                           CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
    while( true ) {
      local_508 = local_500.i;
      bVar2 = QList<OrderedScreen>::iterator::operator!=(&local_4f8,local_500);
      if (!bVar2) break;
      pOVar11 = QList<OrderedScreen>::iterator::operator*(&local_4f8);
      pQVar9 = pOVar11->screen;
      local_510.xp.m_i = -0x55555556;
      local_510.yp.m_i = -0x55555556;
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     in_stack_fffffffffffff92c,in_stack_fffffffffffff928);
      bVar2 = QPoint::isNull((QPoint *)in_stack_fffffffffffff940.i);
      if (bVar2) {
        local_510 = local_4c0;
        VVar5 = QKmsScreenConfig::virtualDesktopLayout((QKmsScreenConfig *)in_RDI[1]);
        if (VVar5 == VirtualDesktopLayoutVertical) {
          auVar17 = (**(code **)(*(long *)pQVar9 + 0x20))();
          local_520 = auVar17;
          iVar3 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffff92c,
                                                  in_stack_fffffffffffff928));
          piVar7 = QPoint::ry((QPoint *)0x119e95);
          *piVar7 = iVar3 + *piVar7;
        }
        else {
          auVar17 = (**(code **)(*(long *)pQVar9 + 0x20))();
          local_530 = auVar17;
          iVar3 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928
                                                ));
          piVar7 = QPoint::rx((QPoint *)0x119ed8);
          *piVar7 = iVar3 + *piVar7;
        }
      }
      else {
        local_510 = (pOVar11->vinfo).virtualPos;
      }
      local_88 = 0xaaaaaaaaaaaaaaaa;
      local_80 = 0xaaaaaaaaaaaaaaaa;
      qLcKmsDebug();
      anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
      while( true ) {
        bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_88);
        if (!bVar2) break;
        anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x119f49);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffff940.i,(char *)in_stack_fffffffffffff938,
                   in_stack_fffffffffffff934,
                   (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                   (char *)0x119f62);
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                           (char *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
        QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                           (void *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                           (char *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
        (**(code **)(*(long *)pQVar9 + 0x90))(local_580);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffff940.i,in_stack_fffffffffffff938);
        QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                           (char *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
        pQVar12 = QDebug::operator<<((QDebug *)
                                     CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                                     (char *)CONCAT44(in_stack_fffffffffffff97c,
                                                      in_stack_fffffffffffff978));
        QDebug::QDebug(&local_540,pQVar12);
        auVar17 = (**(code **)(*(long *)pQVar9 + 0x20))();
        local_590 = auVar17;
        ::operator<<((Stream *)&local_538,(QRect *)&local_540);
        QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                           (char *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
        QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                           SUB41((uint)in_stack_fffffffffffff92c >> 0x18,0));
        QDebug::~QDebug(&local_538);
        QDebug::~QDebug(&local_540);
        QString::~QString((QString *)0x11a08a);
        QDebug::~QDebug((QDebug *)&stack0xfffffffffffffab8);
        local_80 = local_80 & 0xffffffffffffff00;
      }
      bVar2 = QKmsScreenConfig::separateScreens((QKmsScreenConfig *)in_RDI[1]);
      if (bVar2) {
        in_stack_fffffffffffff94f = (pOVar11->vinfo).isPrimary;
        memset(local_5e0,0,0x18);
        QList<QPlatformScreen_*>::QList((QList<QPlatformScreen_*> *)0x11a233);
        pQVar13 = QList<QPlatformScreen_*>::operator<<
                            ((QList<QPlatformScreen_*> *)
                             CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                             (parameter_type)
                             CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        (**(code **)(*in_RDI + 0x40))
                  (in_RDI,pQVar9,in_stack_fffffffffffff94f & 1,&local_510,pQVar13);
        QList<QPlatformScreen_*>::~QList((QList<QPlatformScreen_*> *)0x11a277);
      }
      else {
        local_98 = 0xaaaaaaaaaaaaaaaa;
        local_90 = 0xaaaaaaaaaaaaaaaa;
        qLcKmsDebug();
        anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                   CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928)
                  );
        while( true ) {
          bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                            ((QLoggingCategoryMacroHolder *)&local_98);
          if (!bVar2) break;
          anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11a110);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffff940.i,(char *)in_stack_fffffffffffff938
                     ,in_stack_fffffffffffff934,
                     (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (char *)0x11a129);
          QMessageLogger::debug();
          pQVar12 = QDebug::operator<<((QDebug *)
                                       CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948)
                                       ,(char *)CONCAT44(in_stack_fffffffffffff97c,
                                                         in_stack_fffffffffffff978));
          QDebug::QDebug(&local_5a0,pQVar12);
          ::operator<<((Stream *)&local_598,(QPoint *)&local_5a0);
          QDebug::~QDebug(&local_598);
          QDebug::~QDebug(&local_5a0);
          QDebug::~QDebug(&local_5a8);
          local_90 = local_90 & 0xffffffffffffff00;
        }
        QList<QPlatformScreen_*>::append
                  ((QList<QPlatformScreen_*> *)0x11a1c5,
                   (parameter_type)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        QList<QPoint>::append
                  ((QList<QPoint> *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                   (parameter_type)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        if (((pOVar11->vinfo).isPrimary & 1U) != 0) {
          qVar14 = QList<QPlatformScreen_*>::size(&local_4d8);
          local_664 = (int)qVar14 + -1;
        }
      }
      QList<OrderedScreen>::iterator::operator++(&local_4f8);
    }
    bVar2 = QKmsScreenConfig::separateScreens((QKmsScreenConfig *)in_RDI[1]);
    if (!bVar2) {
      iVar3 = 0;
      while( true ) {
        lVar6 = (long)iVar3;
        qVar14 = QList<QPlatformScreen_*>::size(&local_4d8);
        if (qVar14 <= lVar6) break;
        ppQVar15 = QList<QPlatformScreen_*>::operator[]
                             ((QList<QPlatformScreen_*> *)
                              CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                              CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        pQVar9 = *ppQVar15;
        in_stack_fffffffffffff934 = CONCAT13(iVar3 == local_664,(int3)in_stack_fffffffffffff934);
        pQVar16 = QList<QPoint>::operator[]
                            ((QList<QPoint> *)
                             CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                             CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        (**(code **)(*in_RDI + 0x40))
                  (in_RDI,pQVar9,(byte)((uint)in_stack_fffffffffffff934 >> 0x18) & 1,pQVar16,
                   &local_4d8);
        iVar3 = iVar3 + 1;
      }
    }
    QList<QPoint>::~QList((QList<QPoint> *)0x11a34f);
    QList<QPlatformScreen_*>::~QList((QList<QPlatformScreen_*> *)0x11a35c);
    QList<OrderedScreen>::~QList((QList<OrderedScreen> *)0x11a369);
  }
LAB_0011a369:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QKmsDevice::createScreens()
{
    // Headless mode using a render node: cannot do any output related DRM
    // stuff. Skip it all and register a dummy screen.
    if (m_screenConfig->headless()) {
        QPlatformScreen *screen = createHeadlessScreen();
        if (screen) {
            qCDebug(qLcKmsDebug, "Headless mode enabled");
            registerScreen(screen, true, QPoint(0, 0), QList<QPlatformScreen *>());
            return;
        } else {
            qWarning("QKmsDevice: Requested headless mode without support in the backend. Request is ignored.");
        }
    }

    drmSetClientCap(m_dri_fd, DRM_CLIENT_CAP_UNIVERSAL_PLANES, 1);

#if QT_CONFIG(drm_atomic)
    // check atomic support
    m_has_atomic_support = !drmSetClientCap(m_dri_fd, DRM_CLIENT_CAP_ATOMIC, 1);
    if (m_has_atomic_support) {
        qCDebug(qLcKmsDebug, "Atomic reported as supported");
        if (qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_ATOMIC")) {
            qCDebug(qLcKmsDebug, "Atomic enabled");
        } else {
            qCDebug(qLcKmsDebug, "Atomic disabled");
            m_has_atomic_support = false;
        }
    }
#endif

    drmModeResPtr resources = drmModeGetResources(m_dri_fd);
    if (!resources) {
        qErrnoWarning(errno, "drmModeGetResources failed");
        return;
    }

    discoverPlanes();

    QList<OrderedScreen> screens;

    int wantedConnectorIndex = -1;
    bool ok;
    int idx = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_CONNECTOR_INDEX", &ok);
    if (ok) {
        if (idx >= 0 && idx < resources->count_connectors)
            wantedConnectorIndex = idx;
        else
            qWarning("Invalid connector index %d, must be between 0 and %u", idx, resources->count_connectors - 1);
    }

    for (int i = 0; i < resources->count_connectors; i++) {
        if (wantedConnectorIndex >= 0 && i != wantedConnectorIndex)
            continue;

        drmModeConnectorPtr connector = drmModeGetConnector(m_dri_fd, resources->connectors[i]);
        if (!connector)
            continue;

        ScreenInfo vinfo;
        QPlatformScreen *screen = createScreenForConnector(resources, connector, &vinfo);
        if (screen)
            screens.append(OrderedScreen(screen, vinfo));

        drmModeFreeConnector(connector);
    }

    drmModeFreeResources(resources);

    // Use stable sort to preserve the original (DRM connector) order
    // for outputs with unspecified indices.
    std::stable_sort(screens.begin(), screens.end(), orderedScreenLessThan);
    qCDebug(qLcKmsDebug) << "Sorted screen list:" << screens;

    // The final list of screens is available, so do the second phase setup.
    // Hook up clone sources and targets.
    for (const OrderedScreen &orderedScreen : screens) {
        QList<QPlatformScreen *> screensCloningThisScreen;
        for (const OrderedScreen &s : screens) {
            if (s.vinfo.output.clone_source == orderedScreen.vinfo.output.name)
                screensCloningThisScreen.append(s.screen);
        }
        QPlatformScreen *screenThisScreenClones = nullptr;
        if (!orderedScreen.vinfo.output.clone_source.isEmpty()) {
            for (const OrderedScreen &s : screens) {
                if (s.vinfo.output.name == orderedScreen.vinfo.output.clone_source) {
                    screenThisScreenClones = s.screen;
                    break;
                }
            }
        }
        if (screenThisScreenClones)
            qCDebug(qLcKmsDebug) << orderedScreen.screen->name() << "clones" << screenThisScreenClones;
        if (!screensCloningThisScreen.isEmpty())
            qCDebug(qLcKmsDebug) << orderedScreen.screen->name() << "is cloned by" << screensCloningThisScreen;

        registerScreenCloning(orderedScreen.screen, screenThisScreenClones, screensCloningThisScreen);
    }

    // Figure out the virtual desktop and register the screens to QPA/QGuiApplication.
    QPoint pos(0, 0);
    QList<QPlatformScreen *> siblings;
    QList<QPoint> virtualPositions;
    int primarySiblingIdx = -1;

    for (const OrderedScreen &orderedScreen : screens) {
        QPlatformScreen *s = orderedScreen.screen;
        QPoint virtualPos(0, 0);
        // set up a horizontal or vertical virtual desktop
        if (orderedScreen.vinfo.virtualPos.isNull()) {
            virtualPos = pos;
            if (m_screenConfig->virtualDesktopLayout() == QKmsScreenConfig::VirtualDesktopLayoutVertical)
                pos.ry() += s->geometry().height();
            else
                pos.rx() += s->geometry().width();
        } else {
            virtualPos = orderedScreen.vinfo.virtualPos;
        }
        qCDebug(qLcKmsDebug) << "Adding QPlatformScreen" << s << "(" << s->name() << ")"
                             << "to QPA with geometry" << s->geometry()
                             << "and isPrimary=" << orderedScreen.vinfo.isPrimary;
        // The order in qguiapp's screens list will match the order set by
        // virtualIndex. This is not only handy but also required since for instance
        // evdevtouch relies on it when performing touch device - screen mapping.
        if (!m_screenConfig->separateScreens()) {
            qCDebug(qLcKmsDebug) << "  virtual position is" << virtualPos;
            siblings.append(s);
            virtualPositions.append(virtualPos);
            if (orderedScreen.vinfo.isPrimary)
                primarySiblingIdx = siblings.size() - 1;
        } else {
            registerScreen(s, orderedScreen.vinfo.isPrimary, virtualPos, QList<QPlatformScreen *>() << s);
        }
    }

    if (!m_screenConfig->separateScreens()) {
        // enable the virtual desktop
        for (int i = 0; i < siblings.size(); ++i)
            registerScreen(siblings[i], i == primarySiblingIdx, virtualPositions[i], siblings);
    }
}